

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::f_fsdot(Forth *this)

{
  Cell CVar1;
  _Setbase _Var2;
  _Setprecision _Var3;
  ostream *poVar4;
  double dVar5;
  Forth *this_local;
  
  requireFStackDepth(this,1,"FS.");
  if (this->writeToTarget == ToString) {
    CVar1 = getNumericBase(this);
    _Var2 = std::setbase(CVar1);
    poVar4 = std::operator<<((ostream *)&this->field_0x20,_Var2);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::scientific);
    _Var3 = std::setprecision(this->precision_);
    poVar4 = std::operator<<(poVar4,_Var3);
    dVar5 = ForthStack<double>::getTop(&this->fStack);
    std::ostream::operator<<(poVar4,dVar5);
  }
  else if (this->writeToTarget == ToStdCout) {
    CVar1 = getNumericBase(this);
    _Var2 = std::setbase(CVar1);
    poVar4 = std::operator<<((ostream *)&std::cout,_Var2);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::scientific);
    _Var3 = std::setprecision(this->precision_);
    poVar4 = std::operator<<(poVar4,_Var3);
    dVar5 = ForthStack<double>::getTop(&this->fStack);
    std::ostream::operator<<(poVar4,dVar5);
    std::ostream::flush();
  }
  ForthStack<double>::pop(&this->fStack);
  return;
}

Assistant:

void f_fsdot() {
			REQUIRE_FSTACK_DEPTH(1, "FS.");
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << SETBASE() << std::scientific << std::setprecision(precision_)
					<< static_cast<FCell>(fStack.getTop());
				break;
			case ToStdCout:
				std::cout << SETBASE() << std::scientific << std::setprecision(precision_)
					<< static_cast<FCell>(fStack.getTop());
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
			fStack.pop();
		}